

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_ManFree(Zyx_Man_t *p)

{
  Zyx_Man_t *p_local;
  
  bmcg_sat_solver_stop(p->pSat);
  Vec_WrdFree(p->vInfo);
  Vec_BitFreeP(&p->vUsed2);
  Vec_BitFreeP(&p->vUsed3);
  Vec_IntFree(p->vPairs);
  Vec_IntFree(p->vMidMints);
  Vec_IntFree(p->vVarValues);
  if (p != (Zyx_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Zyx_ManFree( Zyx_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_BitFreeP( &p->vUsed2 );
    Vec_BitFreeP( &p->vUsed3 );
    Vec_IntFree( p->vPairs );
    Vec_IntFree( p->vMidMints );
    Vec_IntFree( p->vVarValues );
    ABC_FREE( p );
}